

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Array.h
# Opt level: O0

void __thiscall
FastVector<ExecutorX86::ExpiredFunctionAddressList,_false,_false>::grow_and_add
          (FastVector<ExecutorX86::ExpiredFunctionAddressList,_false,_false> *this,uint newSize,
          ExpiredFunctionAddressList *val)

{
  uint uVar1;
  uint uVar2;
  ExpiredFunctionAddressList *ptr;
  undefined4 uVar3;
  ExpiredFunctionAddressList *pEVar4;
  uint oldMax;
  ExpiredFunctionAddressList *oldData;
  ExpiredFunctionAddressList *val_local;
  uint newSize_local;
  FastVector<ExecutorX86::ExpiredFunctionAddressList,_false,_false> *this_local;
  
  ptr = this->data;
  uVar1 = this->max;
  grow_no_destroy(this,newSize);
  uVar2 = this->count;
  this->count = uVar2 + 1;
  pEVar4 = this->data + uVar2;
  pEVar4->data = val->data;
  uVar3 = *(undefined4 *)&val->field_0xc;
  pEVar4->count = val->count;
  *(undefined4 *)&pEVar4->field_0xc = uVar3;
  if (ptr != (ExpiredFunctionAddressList *)0x0) {
    NULLC::destruct<ExecutorX86::ExpiredFunctionAddressList>(ptr,(ulong)uVar1);
  }
  return;
}

Assistant:

void grow_and_add(unsigned newSize, const T& val)
	{
		T* oldData = data;
		unsigned oldMax = max;

		grow_no_destroy(newSize);

		data[count++] = val;

		if(oldData)
		{
			if(!skipConstructor)
				NULLC::destruct(oldData, oldMax);
			else
				NULLC::alignedDealloc(oldData);
		}
	}